

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  GatherBase *this_local;
  
  local_18 = this;
  this_local = (GatherBase *)__return_storage_ptr__;
  (**(code **)(*this + 0xa8))();
  std::operator+(&local_38,
                 "#version 310 es                                       \nprecision highp float;                             \nflat in mediump vec4 v_out_0;                      \nout mediump vec4 f_out_0;                          \n"
                 ,&local_58);
  std::operator+(__return_storage_ptr__,&local_38,
                 "void main() {                                      \n    f_out_0 = test_function(v_out_0);              \n}"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                                       \n"
			   ""
			   "precision highp float;                             \n"
			   "flat in mediump vec4 v_out_0;                      \n"
			   "out mediump vec4 f_out_0;                          \n" +
			   TestFunction() + "void main() {                                      \n"
								"    f_out_0 = test_function(v_out_0);              \n"
								"}";
	}